

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O1

void __thiscall polyscope::TransformationGizmo::draw(TransformationGizmo *this)

{
  float fVar1;
  float fVar2;
  mat4 *pmVar3;
  element_type *peVar4;
  float fVar5;
  uint *puVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vec4 vVar52;
  mat4 projMat;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4 Pinv;
  mat4 P;
  uint local_390;
  uint local_38c;
  undefined8 local_388;
  undefined8 local_380;
  undefined1 local_378 [16];
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  undefined1 local_f0 [64];
  undefined1 local_b0 [64];
  mat<4,_4,_float,_(glm::qualifier)0> local_70;
  
  if ((this->enabled).value == true) {
    if ((this->ringProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prepare(this);
    }
    pmVar3 = this->T;
    fVar33 = pmVar3->value[0].field_0.x;
    fVar1 = pmVar3->value[0].field_1.y;
    fVar2 = pmVar3->value[0].field_2.z;
    fVar33 = fVar33 * fVar33 + fVar1 * fVar1 + fVar2 * fVar2;
    if (fVar33 < 0.0) {
      fVar33 = sqrtf(fVar33);
    }
    else {
      auVar26 = vsqrtss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
      fVar33 = auVar26._0_4_;
    }
    local_378 = ZEXT416((uint)(this->gizmoSizeRel * state::lengthScale));
    view::getCameraViewMatrix();
    pmVar3 = this->T;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_130;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_128;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_120;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_118;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_110;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_108;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_f8;
    auVar27 = ZEXT416((uint)pmVar3->value[1].field_0);
    auVar28 = ZEXT416((uint)pmVar3->value[0].field_0);
    auVar26 = vinsertps_avx(auVar27,auVar28,0x10);
    fVar2 = (float)local_128;
    auVar25._0_4_ = auVar26._0_4_ * fVar2;
    fVar5 = (float)(local_128 >> 0x20);
    auVar25._4_4_ = auVar26._4_4_ * fVar5;
    auVar25._8_4_ = auVar26._8_4_ * 0.0;
    auVar25._12_4_ = auVar26._12_4_ * 0.0;
    auVar27 = vinsertps_avx(auVar28,auVar27,0x10);
    auVar9 = ZEXT416((uint)pmVar3->value[1].field_1);
    auVar24 = ZEXT416((uint)pmVar3->value[0].field_1);
    auVar28 = vinsertps_avx(auVar9,auVar24,0x10);
    auVar8 = vmulps_avx512vl(auVar21,auVar28);
    auVar8 = vaddps_avx512vl(auVar25,auVar8);
    auVar24 = vinsertps_avx512f(auVar24,auVar9,0x10);
    auVar9 = vmulps_avx512vl(auVar21,auVar24);
    auVar11 = ZEXT416((uint)pmVar3->value[1].field_2);
    auVar13 = ZEXT416((uint)pmVar3->value[0].field_2);
    auVar25 = vinsertps_avx512f(auVar11,auVar13,0x10);
    auVar10 = vmulps_avx512vl(auVar22,auVar25);
    auVar12._0_4_ = auVar8._0_4_ + auVar10._0_4_;
    auVar12._4_4_ = auVar8._4_4_ + auVar10._4_4_;
    auVar12._8_4_ = auVar8._8_4_ + auVar10._8_4_;
    auVar12._12_4_ = auVar8._12_4_ + auVar10._12_4_;
    auVar8 = vinsertps_avx(auVar13,auVar11,0x10);
    auVar13._0_4_ = auVar27._0_4_ * fVar2 + auVar9._0_4_ + (float)local_108 * auVar8._0_4_;
    auVar13._4_4_ = auVar27._4_4_ * fVar5 + auVar9._4_4_ + (float)(local_108 >> 0x20) * auVar8._4_4_
    ;
    auVar13._8_4_ = auVar27._8_4_ * 0.0 + auVar9._8_4_ + auVar8._8_4_ * 0.0;
    auVar13._12_4_ = auVar27._12_4_ * 0.0 + auVar9._12_4_ + auVar8._12_4_ * 0.0;
    auVar14 = ZEXT416((uint)pmVar3->value[0].field_3);
    auVar15 = ZEXT416((uint)pmVar3->value[1].field_3);
    auVar10 = vinsertps_avx512f(auVar15,auVar14,0x10);
    auVar9 = vmulps_avx512vl(auVar46,auVar10);
    auVar11 = vaddps_avx512vl(auVar12,auVar9);
    auVar9 = vinsertps_avx(auVar14,auVar15,0x10);
    auVar14._0_4_ = (float)local_f8 * auVar9._0_4_;
    auVar14._4_4_ = (float)(local_f8 >> 0x20) * auVar9._4_4_;
    auVar14._8_4_ = auVar9._8_4_ * 0.0;
    auVar14._12_4_ = auVar9._12_4_ * 0.0;
    fVar1 = pmVar3->value[2].field_0.x;
    auVar12 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar3->value[2].field_1));
    auVar13 = vaddps_avx512vl(auVar13,auVar14);
    auVar16._0_4_ = fVar1 * fVar2;
    auVar16._4_4_ = fVar1 * fVar5;
    auVar16._8_4_ = fVar1 * 0.0;
    auVar16._12_4_ = fVar1 * 0.0;
    auVar14 = vmulps_avx512vl(auVar21,auVar12);
    auVar15 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar3->value[2].field_2));
    auVar14 = vaddps_avx512vl(auVar16,auVar14);
    auVar16 = vmulps_avx512vl(auVar22,auVar15);
    auVar14 = vaddps_avx512vl(auVar14,auVar16);
    auVar16 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar3->value[2].field_3));
    auVar17 = vmulps_avx512vl(auVar46,auVar16);
    auVar14 = vaddps_avx512vl(auVar14,auVar17);
    auVar17 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar3->value[3].field_0));
    auVar18 = vmulps_avx512vl(auVar18,auVar17);
    auVar19 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar3->value[3].field_1));
    auVar20 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar3->value[3].field_2));
    auVar21 = vmulps_avx512vl(auVar21,auVar19);
    auVar22 = vmulps_avx512vl(auVar22,auVar20);
    auVar23 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar3->value[3].field_3));
    auVar34._0_4_ = auVar18._0_4_ + auVar21._0_4_ + auVar22._0_4_;
    auVar34._4_4_ = auVar18._4_4_ + auVar21._4_4_ + auVar22._4_4_;
    auVar34._8_4_ = auVar18._8_4_ + auVar21._8_4_ + auVar22._8_4_;
    auVar34._12_4_ = auVar18._12_4_ + auVar21._12_4_ + auVar22._12_4_;
    auVar18 = vmulps_avx512vl(auVar46,auVar23);
    auVar18 = vaddps_avx512vl(auVar34,auVar18);
    fVar2 = (float)local_130;
    fVar5 = (float)(local_130 >> 0x20);
    auVar24 = vmulps_avx512vl(auVar36,auVar24);
    auVar25 = vmulps_avx512vl(auVar37,auVar25);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_100;
    auVar10 = vmulps_avx512vl(auVar51,auVar10);
    fVar38 = auVar10._0_4_ +
             auVar25._0_4_ + auVar28._0_4_ * (float)local_120 + auVar26._0_4_ * fVar2;
    fVar39 = auVar10._4_4_ +
             auVar25._4_4_ + auVar28._4_4_ * (float)(local_120 >> 0x20) + auVar26._4_4_ * fVar5;
    fVar40 = auVar10._8_4_ + auVar25._8_4_ + auVar28._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
    fVar41 = auVar10._12_4_ + auVar25._12_4_ + auVar28._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
    auVar26 = vmulps_avx512vl(auVar51,auVar9);
    fVar42 = auVar27._0_4_ * fVar2 + auVar24._0_4_ + auVar8._0_4_ * (float)local_110 + auVar26._0_4_
    ;
    fVar43 = auVar27._4_4_ * fVar5 + auVar24._4_4_ + auVar8._4_4_ * (float)(local_110 >> 0x20) +
             auVar26._4_4_;
    fVar44 = auVar27._8_4_ * 0.0 + auVar24._8_4_ + auVar8._8_4_ * 0.0 + auVar26._8_4_;
    fVar45 = auVar27._12_4_ * 0.0 + auVar24._12_4_ + auVar8._12_4_ * 0.0 + auVar26._12_4_;
    auVar26 = vmulps_avx512vl(auVar36,auVar12);
    auVar27 = vmulps_avx512vl(auVar37,auVar15);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_100;
    auVar28 = vmulps_avx512vl(auVar10,auVar16);
    auVar47._0_4_ = fVar1 * fVar2 + auVar26._0_4_ + auVar27._0_4_ + auVar28._0_4_;
    auVar47._4_4_ = fVar1 * fVar5 + auVar26._4_4_ + auVar27._4_4_ + auVar28._4_4_;
    auVar47._8_4_ = fVar1 * 0.0 + auVar26._8_4_ + auVar27._8_4_ + auVar28._8_4_;
    auVar47._12_4_ = fVar1 * 0.0 + auVar26._12_4_ + auVar27._12_4_ + auVar28._12_4_;
    auVar26 = vmulps_avx512vl(auVar35,auVar17);
    auVar27 = vmulps_avx512vl(auVar36,auVar19);
    auVar28 = vmulps_avx512vl(auVar37,auVar20);
    auVar8 = vmulps_avx512vl(auVar10,auVar23);
    auVar48._0_4_ = auVar26._0_4_ + auVar27._0_4_ + auVar28._0_4_ + auVar8._0_4_;
    auVar48._4_4_ = auVar26._4_4_ + auVar27._4_4_ + auVar28._4_4_ + auVar8._4_4_;
    auVar48._8_4_ = auVar26._8_4_ + auVar27._8_4_ + auVar28._8_4_ + auVar8._8_4_;
    auVar48._12_4_ = auVar26._12_4_ + auVar27._12_4_ + auVar28._12_4_ + auVar8._12_4_;
    fVar1 = (float)local_378._0_4_ * 0.0;
    auVar49._4_4_ = fVar1;
    auVar49._0_4_ = fVar1;
    auVar49._8_4_ = fVar1;
    auVar49._12_4_ = fVar1;
    auVar15._4_4_ = local_378._0_4_;
    auVar15._0_4_ = local_378._0_4_;
    auVar15._8_4_ = local_378._0_4_;
    auVar15._12_4_ = local_378._0_4_;
    auVar26 = vblendps_avx(auVar49,auVar15,2);
    auVar20._0_4_ = auVar26._0_4_ * fVar38;
    auVar20._4_4_ = auVar26._4_4_ * fVar39;
    auVar20._8_4_ = auVar26._8_4_ * fVar40;
    auVar20._12_4_ = auVar26._12_4_ * fVar41;
    auVar27._4_12_ = auVar49._4_12_;
    auVar27._0_4_ = local_378._0_4_;
    auVar23._0_4_ = fVar42 * (float)local_378._0_4_;
    auVar23._4_4_ = fVar43 * fVar1;
    auVar23._8_4_ = fVar44 * fVar1;
    auVar23._12_4_ = fVar45 * fVar1;
    auVar28 = vmulps_avx512vl(auVar26,auVar11);
    auVar8 = vmulps_avx512vl(auVar27,auVar13);
    auVar26._0_4_ = auVar20._0_4_ + auVar23._0_4_;
    auVar26._4_4_ = auVar20._4_4_ + auVar23._4_4_;
    auVar26._8_4_ = auVar20._8_4_ + auVar23._8_4_;
    auVar26._12_4_ = auVar20._12_4_ + auVar23._12_4_;
    auVar24._0_4_ = auVar28._0_4_ + auVar8._0_4_;
    auVar24._4_4_ = auVar28._4_4_ + auVar8._4_4_;
    auVar24._8_4_ = auVar28._8_4_ + auVar8._8_4_;
    auVar24._12_4_ = auVar28._12_4_ + auVar8._12_4_;
    auVar27 = vmulps_avx512vl(auVar49,auVar47);
    auVar9 = vmulps_avx512vl(auVar49,auVar14);
    auVar26 = vaddps_avx512vl(auVar26,auVar27);
    auVar24 = vaddps_avx512vl(auVar24,auVar9);
    auVar25 = vmulps_avx512vl(auVar49,auVar48);
    auVar10 = vmulps_avx512vl(auVar49,auVar18);
    auVar12 = vaddps_avx512vl(auVar26,auVar25);
    auVar24 = vaddps_avx512vl(auVar24,auVar10);
    auVar26 = vblendps_avx(auVar15,auVar49,2);
    auVar17._0_4_ = auVar26._0_4_ * fVar38;
    auVar17._4_4_ = auVar26._4_4_ * fVar39;
    auVar17._8_4_ = auVar26._8_4_ * fVar40;
    auVar17._12_4_ = auVar26._12_4_ * fVar41;
    auVar50._4_12_ = auVar15._4_12_;
    auVar50._0_4_ = fVar1;
    auVar19._0_4_ = fVar1 * fVar42;
    auVar19._4_4_ = (float)local_378._0_4_ * fVar43;
    auVar19._8_4_ = (float)local_378._0_4_ * fVar44;
    auVar19._12_4_ = (float)local_378._0_4_ * fVar45;
    auVar15 = vaddps_avx512vl(auVar17,auVar19);
    auVar27 = vaddps_avx512vl(auVar15,auVar27);
    auVar27 = vaddps_avx512vl(auVar27,auVar25);
    auVar15 = vmulps_avx512vl(auVar26,auVar11);
    auVar16 = vmulps_avx512vl(auVar50,auVar13);
    auVar26 = vaddps_avx512vl(auVar15,auVar16);
    auVar26 = vaddps_avx512vl(auVar26,auVar9);
    auVar26 = vaddps_avx512vl(auVar26,auVar10);
    auVar30 = vinsertf32x4_avx512f(ZEXT1664(auVar27),auVar26,1);
    auVar31 = vinsertf32x4_avx512f(ZEXT1664(auVar12),auVar24,1);
    auVar29 = vpermi2pd_avx512vl(_DAT_0033b6e0,auVar31._0_32_,auVar30._0_32_);
    auVar26 = vblendps_avx(auVar19,auVar17,2);
    auVar27 = vblendps_avx(auVar20,auVar23,2);
    auVar9._0_4_ = auVar26._0_4_ + auVar27._0_4_ + auVar47._0_4_ * (float)local_378._0_4_;
    auVar9._4_4_ = auVar26._4_4_ + auVar27._4_4_ + auVar47._4_4_ * (float)local_378._0_4_;
    auVar9._8_4_ = auVar26._8_4_ + auVar27._8_4_ + auVar47._8_4_ * (float)local_378._0_4_;
    auVar9._12_4_ = auVar26._12_4_ + auVar27._12_4_ + auVar47._12_4_ * (float)local_378._0_4_;
    auVar9 = vaddps_avx512vl(auVar9,auVar25);
    auVar26 = vblendps_avx(auVar16,auVar15,2);
    auVar27 = vblendps_avx(auVar28,auVar8,2);
    auVar28._0_4_ = auVar26._0_4_ + auVar27._0_4_ + (float)local_378._0_4_ * auVar14._0_4_;
    auVar28._4_4_ = auVar26._4_4_ + auVar27._4_4_ + (float)local_378._0_4_ * auVar14._4_4_;
    auVar28._8_4_ = auVar26._8_4_ + auVar27._8_4_ + (float)local_378._0_4_ * auVar14._8_4_;
    auVar28._12_4_ = auVar26._12_4_ + auVar27._12_4_ + (float)local_378._0_4_ * auVar14._12_4_;
    auVar26 = vaddps_avx512vl(auVar28,auVar10);
    auVar30 = vinsertf32x4_avx512f(ZEXT1664(auVar9),auVar26,1);
    auVar26 = vmulps_avx512vl(auVar11,ZEXT816(0) << 0x20);
    auVar27 = vmulps_avx512vl(auVar13,ZEXT816(0) << 0x20);
    auVar8._0_4_ = auVar26._0_4_ + auVar27._0_4_ + auVar14._0_4_ * 0.0;
    auVar8._4_4_ = auVar26._4_4_ + auVar27._4_4_ + auVar14._4_4_ * 0.0;
    auVar8._8_4_ = auVar26._8_4_ + auVar27._8_4_ + auVar14._8_4_ * 0.0;
    auVar8._12_4_ = auVar26._12_4_ + auVar27._12_4_ + auVar14._12_4_ * 0.0;
    auVar26 = vaddps_avx512vl(auVar8,auVar18);
    auVar31 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar48._12_4_ +
                                            fVar41 * 0.0 + fVar45 * 0.0 + auVar47._12_4_ * 0.0,
                                            CONCAT48(auVar48._8_4_ +
                                                     fVar40 * 0.0 + fVar44 * 0.0 +
                                                     auVar47._8_4_ * 0.0,
                                                     CONCAT44(auVar48._4_4_ +
                                                              fVar39 * 0.0 + fVar43 * 0.0 +
                                                              auVar47._4_4_ * 0.0,
                                                              auVar48._0_4_ +
                                                              fVar38 * 0.0 + fVar42 * 0.0 +
                                                              auVar47._0_4_ * 0.0)))),auVar26,1);
    auVar32 = vbroadcasti64x4_avx512f(_DAT_0033b6c0);
    auVar30 = vpermi2pd_avx512f(auVar32,auVar30,auVar31);
    local_f0 = vinsertf64x4_avx512f(auVar30,auVar29,0);
    peVar4 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"u_modelView","");
    (*peVar4->_vptr_ShaderProgram[7])(peVar4,(string *)local_150,local_f0);
    if (local_150[0] != local_140) {
      operator_delete(local_150[0]);
    }
    peVar4 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"u_modelView","");
    (*peVar4->_vptr_ShaderProgram[7])(peVar4,(string *)local_170,local_f0);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0]);
    }
    peVar4 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"u_modelView","");
    (*peVar4->_vptr_ShaderProgram[7])(peVar4,(string *)local_190,local_f0);
    if (local_190[0] != local_180) {
      operator_delete(local_190[0]);
    }
    view::getCameraPerspectiveMatrix();
    peVar4 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1b0[0] = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"u_projMatrix","");
    (*peVar4->_vptr_ShaderProgram[7])(peVar4,local_1b0,&local_130);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0]);
    }
    peVar4 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"u_projMatrix","");
    (*peVar4->_vptr_ShaderProgram[7])(peVar4,local_1d0,&local_130);
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    peVar4 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"u_projMatrix","");
    (*peVar4->_vptr_ShaderProgram[7])(peVar4,local_1f0,&local_130);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0]);
    }
    peVar4 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_210[0] = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"u_diskWidthRel","");
    (*peVar4->_vptr_ShaderProgram[5])((ulong)(uint)this->diskWidthObj,peVar4,local_210);
    if (local_210[0] != local_200) {
      operator_delete(local_210[0]);
    }
    render::Engine::setMaterialUniforms
              (render::engine,
               (this->arrowProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&this->material);
    render::Engine::setMaterialUniforms
              (render::engine,
               (this->sphereProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&this->material);
    local_380 = 0;
    local_38c = 0;
    local_388 = 0;
    local_390 = 0;
    if (this->selectedType == Rotation) {
      if (this->selectedDim == 2) {
        puVar6 = &local_38c;
      }
      else if (this->selectedDim == 1) {
        puVar6 = (uint *)((long)&local_380 + 4);
      }
      else {
        puVar6 = (uint *)&local_380;
      }
      *puVar6 = 0x3f800000;
    }
    peVar4 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_230[0] = local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"u_active","");
    (*peVar4->_vptr_ShaderProgram[9])(local_380,(ulong)local_38c,peVar4,local_230);
    if (local_230[0] != local_220) {
      operator_delete(local_230[0]);
    }
    if (this->selectedType == Translation) {
      if (this->selectedDim == 2) {
        puVar6 = &local_390;
      }
      else if (this->selectedDim == 1) {
        puVar6 = (uint *)((long)&local_388 + 4);
      }
      else {
        puVar6 = (uint *)&local_388;
      }
      *puVar6 = 0x3f800000;
    }
    peVar4 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"u_active","");
    (*peVar4->_vptr_ShaderProgram[9])(local_388,(ulong)local_390,peVar4,local_250);
    if (local_250[0] != local_240) {
      operator_delete(local_250[0]);
    }
    bVar7 = this->selectedType == Scale;
    if (bVar7) {
      uStack_35c = 0x3f733333;
      local_368 = 0x3f733333;
      uStack_364 = 0x3f733333;
      uStack_360 = 0x3f733333;
    }
    else {
      uStack_35c = 0x3f59999a;
      local_368 = 0x3f59999a;
      uStack_364 = 0x3f59999a;
      uStack_360 = 0x3f59999a;
    }
    view::getCameraPerspectiveMatrix();
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_70);
    peVar4 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"u_invProjMatrix","");
    (*peVar4->_vptr_ShaderProgram[7])(peVar4,local_270,local_b0);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    peVar4 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_290[0] = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"u_viewport","");
    vVar52 = render::Engine::getCurrentViewport(render::engine);
    (*peVar4->_vptr_ShaderProgram[10])(vVar52._0_8_,vVar52._8_8_,peVar4,local_290);
    if (local_290[0] != local_280) {
      operator_delete(local_290[0]);
    }
    peVar4 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2b0[0] = local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"u_lengthMult","");
    (*peVar4->_vptr_ShaderProgram[5])((ulong)(uint)this->vecLength,peVar4,local_2b0);
    if (local_2b0[0] != local_2a0) {
      operator_delete(local_2b0[0]);
    }
    peVar4 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"u_radius","");
    fVar33 = (float)local_378._0_4_ * fVar33;
    local_378._0_4_ = fVar33;
    (*peVar4->_vptr_ShaderProgram[6])((double)fVar33 * 0.2,peVar4,local_2d0);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0]);
    }
    peVar4 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2f0[0] = local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"u_invProjMatrix","");
    (*peVar4->_vptr_ShaderProgram[7])(peVar4,local_2f0,local_b0);
    if (local_2f0[0] != local_2e0) {
      operator_delete(local_2f0[0]);
    }
    peVar4 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_310[0] = local_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"u_viewport","");
    vVar52 = render::Engine::getCurrentViewport(render::engine);
    (*peVar4->_vptr_ShaderProgram[10])(vVar52._0_8_,vVar52._8_8_,peVar4,local_310);
    if (local_310[0] != local_300) {
      operator_delete(local_310[0]);
    }
    peVar4 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_330[0] = local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"u_pointRadius","");
    (*peVar4->_vptr_ShaderProgram[5])
              ((ulong)(uint)((float)local_378._0_4_ * this->sphereRad),peVar4,local_330);
    if (local_330[0] != local_320) {
      operator_delete(local_330[0]);
    }
    peVar4 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"u_baseColor","");
    (*peVar4->_vptr_ShaderProgram[9])
              (CONCAT44(uStack_364,local_368),
               (ulong)((uint)bVar7 * 0x3f733333 + (uint)!bVar7 * 0x3f59999a),peVar4,local_350);
    if (local_350[0] != local_340) {
      operator_delete(local_350[0]);
    }
    (*render::engine->_vptr_Engine[10])(render::engine,0);
    (*render::engine->_vptr_Engine[0xb])(render::engine,0);
    (*render::engine->_vptr_Engine[0xd])(render::engine,0);
    (*((this->ringProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x24])();
    (*((this->arrowProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x24])();
    (*((this->sphereProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x24])();
  }
  return;
}

Assistant:

void TransformationGizmo::draw() {
  if (!enabled.get()) return;
  if (!ringProgram) prepare();

  // == set uniforms

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSizePreTrans = gizmoSizeRel * state::lengthScale;
  float gizmoSize = transScale * gizmoSizePreTrans;

  glm::mat4 viewMat =
      view::getCameraViewMatrix() * T * glm::scale(glm::vec3{gizmoSizePreTrans, gizmoSizePreTrans, gizmoSizePreTrans});
  ringProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  arrowProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  sphereProgram->setUniform("u_modelView", glm::value_ptr(viewMat));

  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  ringProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  arrowProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  sphereProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));

  ringProgram->setUniform("u_diskWidthRel", diskWidthObj);


  render::engine->setMaterialUniforms(*arrowProgram, material);
  render::engine->setMaterialUniforms(*sphereProgram, material);

  // set selections
  glm::vec3 selectRot{0., 0., 0.};
  glm::vec3 selectTrans{0., 0., 0.};
  glm::vec3 sphereColor(0.85);
  if (selectedType == TransformHandle::Rotation) {
    selectRot[selectedDim] = 1.;
  }
  ringProgram->setUniform("u_active", selectRot);
  if (selectedType == TransformHandle::Translation) {
    selectTrans[selectedDim] = 1.;
  }
  arrowProgram->setUniform("u_active", selectTrans);
  if (selectedType == TransformHandle::Scale) {
    sphereColor = glm::vec3(0.95);
  }

  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  arrowProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  arrowProgram->setUniform("u_viewport", render::engine->getCurrentViewport());
  arrowProgram->setUniform("u_lengthMult", vecLength);
  arrowProgram->setUniform("u_radius", 0.2 * gizmoSize);

  sphereProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  sphereProgram->setUniform("u_viewport", render::engine->getCurrentViewport());

  sphereProgram->setUniform("u_pointRadius", sphereRad * gizmoSize);
  sphereProgram->setUniform("u_baseColor", sphereColor);

  render::engine->setDepthMode(DepthMode::Less);
  render::engine->setBlendMode(BlendMode::AlphaOver);
  render::engine->setBackfaceCull(false);

  // == draw

  ringProgram->draw();
  arrowProgram->draw();
  sphereProgram->draw();
}